

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *in,QDateTime *dateTime)

{
  int iVar1;
  QDate date;
  QDataStream *pQVar2;
  QTimeZone *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qint32 offset;
  QTimeZone zone;
  qint8 ts;
  QTime tm;
  QDate dt;
  undefined4 in_stack_fffffffffffffea8;
  Initialization in_stack_fffffffffffffeac;
  QDateTime *in_stack_fffffffffffffeb0;
  QDataStream *in_stack_fffffffffffffeb8;
  QDataStream *in_stack_fffffffffffffec0;
  TransitionResolution in_stack_fffffffffffffecc;
  QDateTime *in_stack_fffffffffffffed0;
  QTime QVar3;
  QDate in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  QDateTime *this;
  QTime in_stack_fffffffffffffef4;
  QDate in_stack_fffffffffffffef8;
  QDateTime local_70;
  int local_64;
  undefined1 *local_60;
  int local_4c;
  undefined1 *local_48;
  undefined4 local_2c;
  undefined1 *local_20;
  char local_15;
  QTime local_14;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QDate::QDate((QDate *)in_stack_fffffffffffffeb0);
  local_14.mds = -0x55555556;
  QTime::QTime(&local_14);
  local_15 = '\0';
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QTimeZone::QTimeZone((QTimeZone *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  iVar1 = QDataStream::version(in_RDI);
  if (iVar1 < 0xf) {
    iVar1 = QDataStream::version(in_RDI);
    if (iVar1 == 0xd) {
      operator>>(in_stack_fffffffffffffec0,(QDate *)in_stack_fffffffffffffeb8);
      QVar3.mds = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
      operator>>(in_stack_fffffffffffffec0,(QTime *)in_stack_fffffffffffffeb8);
      QDataStream::operator>>(in_stack_fffffffffffffeb8,(qint8 *)in_stack_fffffffffffffeb0);
      local_60 = local_10;
      local_64 = local_14.mds;
      this = &local_70;
      QTimeZone::QTimeZone((QTimeZone *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
      QDateTime::QDateTime
                ((QDateTime *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffed8,QVar3,
                 (QTimeZone *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
      QDateTime::operator=
                (in_stack_fffffffffffffeb0,
                 (QDateTime *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      QDateTime::~QDateTime((QDateTime *)0x5751b6);
      QTimeZone::~QTimeZone((QTimeZone *)0x5751c3);
      if (local_15 == '\0') {
        QDateTime::toTimeZone
                  (this,(QTimeZone *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        QDateTime::operator=
                  (in_stack_fffffffffffffeb0,
                   (QDateTime *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        QDateTime::~QDateTime((QDateTime *)0x575211);
      }
    }
    else {
      iVar1 = QDataStream::version(in_RDI);
      if (iVar1 < 7) {
        pQVar2 = operator>>(in_stack_fffffffffffffec0,(QDate *)in_stack_fffffffffffffeb8);
        operator>>(pQVar2,(QTime *)in_stack_fffffffffffffeb8);
        QDateTime::QDateTime
                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                   in_stack_fffffffffffffecc);
        QDateTime::operator=
                  (in_stack_fffffffffffffeb0,
                   (QDateTime *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        QDateTime::~QDateTime((QDateTime *)0x575415);
      }
      else {
        date.jd = (qint64)operator>>(in_stack_fffffffffffffec0,(QDate *)in_stack_fffffffffffffeb8);
        pQVar2 = operator>>(in_stack_fffffffffffffec0,(QTime *)in_stack_fffffffffffffeb8);
        QVar3.mds = (int)((ulong)pQVar2 >> 0x20);
        QDataStream::operator>>(in_stack_fffffffffffffeb8,(qint8 *)in_stack_fffffffffffffeb0);
        if ((2 < (int)local_15 + 1U) && ((int)local_15 - 2U < 2)) {
          QTimeZone::QTimeZone((QTimeZone *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
          QTimeZone::operator=
                    ((QTimeZone *)in_stack_fffffffffffffeb0,
                     (QTimeZone *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
          QTimeZone::~QTimeZone((QTimeZone *)0x57530d);
        }
        QDateTime::QDateTime
                  ((QDateTime *)in_stack_fffffffffffffeb8,date,QVar3,
                   (QTimeZone *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
        QDateTime::operator=
                  (in_stack_fffffffffffffeb0,
                   (QDateTime *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        QDateTime::~QDateTime((QDateTime *)0x57537d);
      }
    }
  }
  else {
    operator>>(in_stack_fffffffffffffec0,(QDate *)in_stack_fffffffffffffeb8);
    QVar3.mds = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
    operator>>(in_stack_fffffffffffffec0,(QTime *)in_stack_fffffffffffffeb8);
    QDataStream::operator>>(in_stack_fffffffffffffeb8,(qint8 *)in_stack_fffffffffffffeb0);
    switch(local_15) {
    case '\0':
      break;
    case '\x01':
      QTimeZone::QTimeZone((QTimeZone *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
      QTimeZone::operator=
                ((QTimeZone *)in_stack_fffffffffffffeb0,
                 (QTimeZone *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      QTimeZone::~QTimeZone((QTimeZone *)0x574fe0);
      break;
    case '\x02':
      local_2c = 0;
      QDataStream::operator>>(in_stack_fffffffffffffeb8,(qint32 *)in_stack_fffffffffffffeb0);
      QTimeZone::fromSecondsAheadOfUtc(in_stack_fffffffffffffecc);
      QTimeZone::operator=
                ((QTimeZone *)in_stack_fffffffffffffeb0,
                 (QTimeZone *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      QTimeZone::~QTimeZone((QTimeZone *)0x57503c);
      break;
    case '\x03':
      operator>>(in_RDI,in_RSI);
    }
    local_48 = local_10;
    local_4c = local_14.mds;
    QDateTime::QDateTime
              ((QDateTime *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffed8,QVar3,
               (QTimeZone *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    QDateTime::operator=
              (in_stack_fffffffffffffeb0,
               (QDateTime *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    QDateTime::~QDateTime((QDateTime *)0x5750c5);
  }
  QTimeZone::~QTimeZone((QTimeZone *)0x575433);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &in, QDateTime &dateTime)
{
    QDate dt;
    QTime tm;
    qint8 ts = 0;
    QTimeZone zone(QTimeZone::LocalTime);

    if (in.version() >= QDataStream::Qt_5_2) {

        // In 5.2 we switched to using Qt::TimeSpec and added offset and zone support
        in >> dt >> tm >> ts;
        switch (static_cast<Qt::TimeSpec>(ts)) {
        case Qt::UTC:
            zone = QTimeZone::UTC;
            break;
        case Qt::OffsetFromUTC: {
            qint32 offset = 0;
            in >> offset;
            zone = QTimeZone::fromSecondsAheadOfUtc(offset);
            break;
        }
        case Qt::LocalTime:
            break;
        case Qt::TimeZone:
            in >> zone;
            break;
        }
        // Note: no way to resolve transition ambiguity, when relevant; use default.
        dateTime = QDateTime(dt, tm, zone);

    } else if (in.version() == QDataStream::Qt_5_0) {

        // In Qt 5.0 we incorrectly serialised all datetimes as UTC
        in >> dt >> tm >> ts;
        dateTime = QDateTime(dt, tm, QTimeZone::UTC);
        if (static_cast<Qt::TimeSpec>(ts) == Qt::LocalTime)
            dateTime = dateTime.toTimeZone(zone);

    } else if (in.version() >= QDataStream::Qt_4_0) {

        // From 4.0 to 5.1 (except 5.0) we used QDateTimePrivate::Spec
        in >> dt >> tm >> ts;
        switch (static_cast<QDateTimePrivate::Spec>(ts)) {
        case QDateTimePrivate::OffsetFromUTC: // No offset was stored, so treat as UTC.
        case QDateTimePrivate::UTC:
            zone = QTimeZone::UTC;
            break;
        case QDateTimePrivate::TimeZone: // No zone was stored, so treat as LocalTime:
        case QDateTimePrivate::LocalUnknown:
        case QDateTimePrivate::LocalStandard:
        case QDateTimePrivate::LocalDST:
            break;
        }
        dateTime = QDateTime(dt, tm, zone);

    } else { // version < QDataStream::Qt_4_0

        // Before 4.0 there was no TimeSpec, only Qt::LocalTime was supported
        in >> dt >> tm;
        dateTime = QDateTime(dt, tm);

    }

    return in;
}